

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O0

bool __thiscall FIX::SocketMonitor::addWrite(SocketMonitor *this,socket_handle s)

{
  bool bVar1;
  _Self local_40;
  _Self local_38;
  iterator i;
  _Self local_28;
  socket_handle local_1c;
  SocketMonitor *pSStack_18;
  socket_handle s_local;
  SocketMonitor *this_local;
  
  local_1c = s;
  pSStack_18 = this;
  local_28._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::find(&this->m_readSockets,&local_1c);
  i = std::set<int,_std::less<int>,_std::allocator<int>_>::end(&this->m_readSockets);
  bVar1 = std::operator==(&local_28,&i);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    socket_setnonblock(local_1c);
    local_38._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::find(&this->m_writeSockets,&local_1c);
    local_40._M_node =
         (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(&this->m_writeSockets);
    bVar1 = std::operator!=(&local_38,&local_40);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      std::set<int,_std::less<int>,_std::allocator<int>_>::insert(&this->m_writeSockets,&local_1c);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool SocketMonitor::addWrite(socket_handle s) {
  if (m_readSockets.find(s) == m_readSockets.end()) {
    return false;
  }

  socket_setnonblock(s);
  Sockets::iterator i = m_writeSockets.find(s);
  if (i != m_writeSockets.end()) {
    return false;
  }

  m_writeSockets.insert(s);
  return true;
}